

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboTestUtil.cpp
# Opt level: O1

void __thiscall
deqp::gles3::Functional::FboTestUtil::DepthGradientShader::shadeFragments
          (DepthGradientShader *this,FragmentPacket *packets,int numPackets,
          FragmentShadingContext *context)

{
  float fVar1;
  float fVar2;
  int iVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  int iVar8;
  long lVar9;
  GenericVec4 *pGVar10;
  deUint32 dVar11;
  int fragNdx;
  int fragNdx_00;
  FragmentPacket *packet;
  int iVar12;
  Vec4 color;
  UVec4 uicolor;
  IVec4 icolor;
  Vec4 coord;
  Vec4 local_88;
  deUint32 local_78;
  deUint32 local_74;
  deUint32 local_70;
  deUint32 local_6c;
  deUint32 local_68;
  deUint32 local_64;
  deUint32 local_60;
  deUint32 local_5c;
  ulong local_58;
  FragmentPacket *local_50;
  ulong local_48;
  float local_40;
  float local_3c;
  
  fVar1 = (this->u_minGradient->value).f;
  fVar2 = (this->u_maxGradient->value).f;
  local_88.m_data._0_8_ = *(undefined8 *)&this->u_color->value;
  local_88.m_data._8_8_ = *(undefined8 *)((long)&this->u_color->value + 8);
  local_50 = packets;
  castVectorSaturate<int>(&local_88);
  castVectorSaturate<unsigned_int>(&local_88);
  if (0 < numPackets) {
    fVar4 = local_88.m_data[0];
    fVar5 = local_88.m_data[1];
    fVar6 = local_88.m_data[2];
    fVar7 = local_88.m_data[3];
    local_58 = (ulong)(uint)numPackets;
    iVar12 = 0;
    local_48 = 0;
    do {
      packet = local_50 + local_48;
      fragNdx_00 = 0;
      do {
        rr::readTriangleVarying<float>((rr *)&local_40,packet,context,0,fragNdx_00);
        iVar8 = iVar12 + fragNdx_00;
        context->fragmentDepths[context->numSamples * iVar8] =
             (local_40 + local_3c) * 0.5 * (fVar2 - fVar1) + fVar1;
        iVar3 = *(int *)&(this->super_ShaderProgram).field_0x154;
        if (iVar3 == 0x22) {
          pGVar10 = context->outputArray;
          lVar9 = (long)(iVar8 * context->numFragmentOutputs);
          pGVar10[lVar9].v.uData[0] = local_78;
          pGVar10[lVar9].v.uData[1] = local_74;
          pGVar10[lVar9].v.uData[2] = local_70;
          dVar11 = local_6c;
LAB_012d19cf:
          pGVar10[lVar9].v.uData[3] = dVar11;
        }
        else {
          if (iVar3 == 0x1e) {
            pGVar10 = context->outputArray;
            lVar9 = (long)(iVar8 * context->numFragmentOutputs);
            pGVar10[lVar9].v.uData[0] = local_68;
            pGVar10[lVar9].v.uData[1] = local_64;
            pGVar10[lVar9].v.uData[2] = local_60;
            dVar11 = local_5c;
            goto LAB_012d19cf;
          }
          if (iVar3 == 4) {
            pGVar10 = context->outputArray;
            iVar8 = iVar8 * context->numFragmentOutputs;
            pGVar10[iVar8].v.uData[0] = (deUint32)fVar4;
            pGVar10[iVar8].v.uData[1] = (deUint32)fVar5;
            pGVar10[iVar8].v.uData[2] = (deUint32)fVar6;
            pGVar10[iVar8].v.uData[3] = (deUint32)fVar7;
          }
        }
        fragNdx_00 = fragNdx_00 + 1;
      } while (fragNdx_00 != 4);
      local_48 = local_48 + 1;
      iVar12 = iVar12 + 4;
    } while (local_48 != local_58);
  }
  return;
}

Assistant:

void DepthGradientShader::shadeFragments (rr::FragmentPacket* packets, const int numPackets, const rr::FragmentShadingContext& context) const
{
	const float			gradientMin	(u_minGradient.value.f);
	const float			gradientMax	(u_maxGradient.value.f);
	const tcu::Vec4		color		(u_color.value.f4);
	const tcu::IVec4	icolor		(castVectorSaturate<deInt32>(color));
	const tcu::UVec4	uicolor		(castVectorSaturate<deUint32>(color));

	// running this shader without a depth buffer does not make any sense
	DE_ASSERT(context.fragmentDepths);

	for (int packetNdx = 0; packetNdx < numPackets; ++packetNdx)
	for (int fragNdx = 0; fragNdx < 4; ++fragNdx)
	{
		const tcu::Vec4		coord	= rr::readTriangleVarying<float>(packets[packetNdx], context, 0, fragNdx);
		const float			x		= coord.x();
		const float			y		= coord.y();
		const float			f0		= (x + y) * 0.5f;

		rr::writeFragmentDepth(context, packetNdx, fragNdx, 0, gradientMin + (gradientMax-gradientMin) * f0);

		if (m_outputType == glu::TYPE_FLOAT_VEC4)			rr::writeFragmentOutput(context, packetNdx, fragNdx, 0, color);
		else if (m_outputType == glu::TYPE_INT_VEC4)		rr::writeFragmentOutput(context, packetNdx, fragNdx, 0, icolor);
		else if (m_outputType == glu::TYPE_UINT_VEC4)		rr::writeFragmentOutput(context, packetNdx, fragNdx, 0, uicolor);
		else
			DE_ASSERT(DE_FALSE);
	}
}